

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcOpBool.c
# Opt level: O3

Mvc_Cover_t * Mvc_CoverBooleanOr(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  int *piVar1;
  Mvc_Cover_t *pCover;
  Mvc_Cube_t *pMVar2;
  Mvc_Cube_t *pMVar3;
  Mvc_List_t *pList;
  Mvc_Cube_t *pMVar4;
  Mvc_List_t *pList_1;
  
  if (pCover1->nBits == pCover2->nBits) {
    pCover = Mvc_CoverClone(pCover1);
    pMVar4 = (pCover1->lCubes).pHead;
    if (pMVar4 != (Mvc_Cube_t *)0x0) {
      do {
        pMVar2 = Mvc_CubeDup(pCover,pMVar4);
        pMVar3 = (Mvc_Cube_t *)&pCover->lCubes;
        if ((pCover->lCubes).pHead != (Mvc_Cube_t *)0x0) {
          pMVar3 = (pCover->lCubes).pTail;
        }
        pMVar3->pNext = pMVar2;
        (pCover->lCubes).pTail = pMVar2;
        pMVar2->pNext = (Mvc_Cube_t *)0x0;
        piVar1 = &(pCover->lCubes).nItems;
        *piVar1 = *piVar1 + 1;
        pMVar4 = pMVar4->pNext;
      } while (pMVar4 != (Mvc_Cube_t *)0x0);
    }
    pMVar4 = (pCover2->lCubes).pHead;
    if (pMVar4 != (Mvc_Cube_t *)0x0) {
      do {
        pMVar2 = Mvc_CubeDup(pCover,pMVar4);
        pMVar3 = (Mvc_Cube_t *)&pCover->lCubes;
        if ((pCover->lCubes).pHead != (Mvc_Cube_t *)0x0) {
          pMVar3 = (pCover->lCubes).pTail;
        }
        pMVar3->pNext = pMVar2;
        (pCover->lCubes).pTail = pMVar2;
        pMVar2->pNext = (Mvc_Cube_t *)0x0;
        piVar1 = &(pCover->lCubes).nItems;
        *piVar1 = *piVar1 + 1;
        pMVar4 = pMVar4->pNext;
      } while (pMVar4 != (Mvc_Cube_t *)0x0);
    }
    return pCover;
  }
  __assert_fail("pCover1->nBits == pCover2->nBits",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcOpBool.c"
                ,0x30,"Mvc_Cover_t *Mvc_CoverBooleanOr(Mvc_Cover_t *, Mvc_Cover_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mvc_Cover_t * Mvc_CoverBooleanOr( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    // make sure the covers are compatible
    assert( pCover1->nBits == pCover2->nBits );
    // clone the cover
    pCover = Mvc_CoverClone( pCover1 );
    // create the cubes by making pair-wise products
    // of cubes in pCover1 and pCover2
    Mvc_CoverForEachCube( pCover1, pCube )
    {
        pCubeCopy = Mvc_CubeDup( pCover, pCube );
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );
    }
    Mvc_CoverForEachCube( pCover2, pCube )
    {
        pCubeCopy = Mvc_CubeDup( pCover, pCube );
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );
    }
    return pCover;
}